

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O2

int live(ps_config_t *config,FILE *infile)

{
  int iVar1;
  ps_decoder_t *ps;
  long lVar2;
  ps_endpointer_t *ep;
  ps_vad_t *vad;
  size_t n_elem;
  int16 *frame;
  __sighandler_t p_Var3;
  size_t sVar4;
  int16 *data;
  size_t end_samples;
  
  ps = ps_init(config);
  if (ps == (ps_decoder_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x162,"PocketSphinx decoder init failed\n");
LAB_001081e4:
    exit(1);
  }
  lVar2 = ps_config_int(config,"samprate");
  ep = ps_endpointer_init(0.0,0.0,PS_VAD_LOOSE,(int)lVar2,0.0);
  if (ep == (ps_endpointer_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x168,"PocketSphinx endpointer init failed\n");
  }
  else {
    vad = ps_endpointer_vad(ep);
    n_elem = ps_vad_frame_size(vad);
    frame = (int16 *)__ckd_calloc__(n_elem,2,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                    ,0x16c);
    if (frame != (int16 *)0x0) {
      p_Var3 = signal(2,catch_sig);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x171,"Failed to set SIGINT handler");
        goto LAB_001081e4;
      }
      while (global_done == '\0') {
        iVar1 = ps_endpointer_in_speech(ep);
        sVar4 = fread(frame,2,n_elem,(FILE *)infile);
        if (sVar4 == n_elem) {
          data = ps_endpointer_process(ep,frame);
        }
        else {
          if (sVar4 == 0) break;
          data = ps_endpointer_end_stream(ep,frame,n_elem,&end_samples);
        }
        if (data != (int16 *)0x0) {
          if (iVar1 == 0) {
            ps_endpointer_speech_start(ep);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x184,"Speech start at %.2f\n");
            ps_start_utt(ps);
          }
          iVar1 = ps_process_raw(ps,data,n_elem,0,0);
          if (iVar1 < 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x188,"ps_process_raw() failed\n");
            ckd_free(frame);
            goto LAB_00108184;
          }
          iVar1 = ps_endpointer_in_speech(ep);
          if (iVar1 == 0) {
            ps_endpointer_speech_end(ep);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x18d,"Speech end at %.2f\n");
            ps_end_utt(ps);
            iVar1 = ps_config_bool(ps->config,"phone_align");
            if (iVar1 != 0) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                      ,400,"Subword alignment not yet supported in live mode\n");
            }
            output_hyp(ep,ps,(ps_alignment_t *)0x0);
          }
        }
      }
      ckd_free(frame);
      ps_endpointer_free(ep);
      iVar1 = 0;
      goto LAB_0010818f;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x16d,"Failed to allocate frame");
LAB_00108184:
    ps_endpointer_free(ep);
  }
  iVar1 = -1;
LAB_0010818f:
  ps_free(ps);
  return iVar1;
}

Assistant:

static int
live(ps_config_t *config, FILE *infile)
{
    ps_decoder_t *decoder = NULL;
    ps_endpointer_t *ep = NULL;
    short *frame = NULL;
    size_t frame_size;

    if ((decoder = ps_init(config)) == NULL) {
        E_FATAL("PocketSphinx decoder init failed\n");
        goto error_out;
    }
    if ((ep = ps_endpointer_init(0, 0.0,
                                 0, ps_config_int(config, "samprate"),
                                 0)) == NULL) {
        E_ERROR("PocketSphinx endpointer init failed\n");
        goto error_out;
    }
    frame_size = ps_endpointer_frame_size(ep);
    if ((frame = ckd_calloc(frame_size, sizeof(frame[0]))) == NULL) {
        E_ERROR("Failed to allocate frame");
        goto error_out;
    }
    if (signal(SIGINT, catch_sig) == SIG_ERR)
        E_FATAL_SYSTEM("Failed to set SIGINT handler");
    while (!global_done) {
        const int16 *speech;
        int prev_in_speech = ps_endpointer_in_speech(ep);
        size_t len, end_samples;
        if ((len = fread(frame, sizeof(frame[0]),
                         frame_size, infile)) != frame_size) {
            if (len > 0) {
                speech = ps_endpointer_end_stream(ep, frame,
                                                  frame_size,
                                                  &end_samples);
            }
            else
                break;
        } else
            speech = ps_endpointer_process(ep, frame);
        if (speech != NULL) {
            if (!prev_in_speech) {
                E_INFO("Speech start at %.2f\n",
                       ps_endpointer_speech_start(ep));
                ps_start_utt(decoder);
            }
            if (ps_process_raw(decoder, speech, frame_size, FALSE, FALSE) < 0) {
                E_ERROR("ps_process_raw() failed\n");
                goto error_out;
            }
            if (!ps_endpointer_in_speech(ep)) {
                E_INFO("Speech end at %.2f\n",
                       ps_endpointer_speech_end(ep));
                ps_end_utt(decoder);
                if (ps_config_bool(decoder->config, "phone_align"))
                    E_WARN("Subword alignment not yet supported in live mode\n");
                output_hyp(ep, decoder, NULL);
            }
        }
    }
    ckd_free(frame);
    ps_endpointer_free(ep);
    ps_free(decoder);
    return 0;

error_out:
    if (frame)
        ckd_free(frame);
    if (ep)
        ps_endpointer_free(ep);
    if (decoder)
        ps_free(decoder);
    return -1;
}